

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::XmlReporter::StartTesting(XmlReporter *this)

{
  byte bVar1;
  ostream *os;
  IConfig *pIVar2;
  string *attribute;
  long in_RDI;
  ReporterConfig *in_stack_ffffffffffffff08;
  XmlWriter *in_stack_ffffffffffffff10;
  allocator *name;
  undefined7 in_stack_ffffffffffffff20;
  Ptr<Catch::IConfig> local_b8;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  Ptr<Catch::IConfig> local_68;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  os = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
  XmlWriter::setStream((XmlWriter *)(in_RDI + 0x28),os);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Catch",&local_29);
  XmlWriter::startElement(in_stack_ffffffffffffff10,(string *)in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  ReporterConfig::fullConfig(in_stack_ffffffffffffff08);
  pIVar2 = Ptr<Catch::IConfig>::operator->(&local_68);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_60);
  bVar1 = std::__cxx11::string::empty();
  bVar1 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_60);
  Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)in_stack_ffffffffffffff10);
  if ((bVar1 & 1) != 0) {
    attribute = (string *)(in_RDI + 0x28);
    name = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"name",name);
    ReporterConfig::fullConfig(in_stack_ffffffffffffff08);
    pIVar2 = Ptr<Catch::IConfig>::operator->(&local_b8);
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_b0);
    XmlWriter::writeAttribute
              ((XmlWriter *)CONCAT17(bVar1,in_stack_ffffffffffffff20),(string *)name,attribute);
    std::__cxx11::string::~string(local_b0);
    Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)attribute);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  return;
}

Assistant:

virtual void StartTesting() {
            m_xml.setStream( m_config.stream() );
            m_xml.startElement( "Catch" );
            if( !m_config.fullConfig()->name().empty() )
                m_xml.writeAttribute( "name", m_config.fullConfig()->name() );
        }